

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  XXH_errorcode XVar10;
  uint uVar11;
  hash_manifest_result_t hVar12;
  istream *piVar13;
  XXH64_state_t *statePtr;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  uchar *md;
  long *plVar17;
  XXH64_hash_t XVar18;
  invalid_argument *piVar19;
  bool bVar20;
  size_type *psVar21;
  size_type sVar22;
  int iVar23;
  char *pcVar24;
  string *psVar25;
  ulong uVar26;
  string *psVar27;
  ulong uVar28;
  byte *pbVar29;
  uchar *puVar30;
  uint shift_bits_by;
  bool bVar31;
  uint shift_bits_by_1;
  size_t sVar32;
  char hex_result [17];
  undefined2 uStack_564;
  undefined1 uStack_562;
  undefined1 uStack_561;
  uchar result_1 [32];
  string tensor_layer_name;
  hash_params params;
  uchar uuidv5_namespace [16];
  undefined1 local_4a8 [17];
  undefined4 uStack_497;
  undefined4 uStack_493;
  undefined7 uStack_48f;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined1 local_478;
  undefined8 local_468;
  XXH64_state_t *local_460;
  uint local_454;
  ggml_context *ctx_data;
  char result [21];
  string manifest_entry_line;
  string arg_prefix;
  ios_base local_340 [264];
  string arg;
  
  psVar27 = (string *)(ulong)(uint)argc;
  params.input._M_dataplus._M_p = (pointer)&params.input.field_2;
  bVar20 = false;
  params.input._M_string_length = 0;
  params.input.field_2._M_local_buf[0] = '\0';
  params.manifest_file._M_dataplus._M_p = (pointer)&params.manifest_file.field_2;
  params.xxh64 = false;
  params.sha1 = false;
  params.sha256 = false;
  params.uuid = false;
  params.no_layer = false;
  params.manifest_is_usable = false;
  params.manifest_file._M_string_length = 0;
  params.manifest_file.field_2._M_local_buf[0] = '\0';
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  arg_prefix._M_dataplus._M_p = (pointer)&arg_prefix.field_2;
  arg_prefix.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
  arg_prefix._M_string_length = 2;
  arg_prefix.field_2._M_local_buf[2] = '\0';
  iVar23 = 1;
  if (1 < argc) {
    bVar20 = false;
    while( true ) {
      pcVar24 = argv[iVar23];
      iVar4 = strncmp(pcVar24,"--",2);
      sVar22 = arg._M_string_length;
      if (iVar4 != 0) break;
      strlen(pcVar24);
      std::__cxx11::string::_M_replace((ulong)&arg,0,(char *)sVar22,(ulong)pcVar24);
      iVar4 = std::__cxx11::string::compare((ulong)&arg,0,(string *)arg_prefix._M_string_length);
      if ((iVar4 == 0) && (arg._M_string_length != 0)) {
        sVar22 = 0;
        do {
          if (arg._M_dataplus._M_p[sVar22] == '_') {
            arg._M_dataplus._M_p[sVar22] = '-';
          }
          sVar22 = sVar22 + 1;
        } while (arg._M_string_length != sVar22);
      }
      iVar4 = std::__cxx11::string::compare((char *)&arg);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&arg), iVar4 == 0)) {
        hash_print_usage(*argv);
        exit(0);
      }
      iVar4 = std::__cxx11::string::compare((char *)&arg);
      if (iVar4 == 0) {
        params.xxh64 = true;
      }
      iVar5 = std::__cxx11::string::compare((char *)&arg);
      if (iVar5 == 0) {
        params.sha1 = true;
      }
      iVar6 = std::__cxx11::string::compare((char *)&arg);
      if (iVar6 == 0) {
        params.uuid = true;
      }
      iVar7 = std::__cxx11::string::compare((char *)&arg);
      if (iVar7 == 0) {
        params.sha256 = true;
      }
      iVar8 = std::__cxx11::string::compare((char *)&arg);
      if (iVar8 == 0) {
        params.xxh64 = false;
        params.sha1 = false;
        params.sha256 = true;
        params.xxh64 = true;
        params.sha1 = true;
      }
      iVar9 = std::__cxx11::string::compare((char *)&arg);
      if (iVar9 == 0) {
        params.no_layer = true;
      }
      bVar31 = iVar9 == 0 ||
               (iVar8 == 0 || (iVar7 == 0 || (iVar6 == 0 || (iVar5 == 0 || iVar4 == 0))));
      iVar4 = std::__cxx11::string::compare((char *)&arg);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&arg), iVar4 == 0)) {
        sVar22 = params.manifest_file._M_string_length;
        iVar23 = iVar23 + 1;
        if (iVar23 < argc) {
          pcVar24 = argv[iVar23];
          strlen(pcVar24);
          bVar31 = true;
          std::__cxx11::string::_M_replace
                    ((ulong)&params.manifest_file,0,(char *)sVar22,(ulong)pcVar24);
          goto LAB_001026d8;
        }
        bVar20 = true;
        bVar1 = false;
      }
      else {
LAB_001026d8:
        bVar1 = true;
        if (!bVar31) {
          piVar19 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&manifest_entry_line,"error: unknown argument: ",&arg);
          std::invalid_argument::invalid_argument(piVar19,(string *)&manifest_entry_line);
          __cxa_throw(piVar19,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      if ((!bVar1) || (iVar23 = iVar23 + 1, argc <= iVar23)) break;
    }
  }
  sVar22 = params.input._M_string_length;
  if (bVar20) {
    piVar19 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&manifest_entry_line,"error: invalid parameter for argument:",&arg);
    std::invalid_argument::invalid_argument(piVar19,(string *)&manifest_entry_line);
    __cxa_throw(piVar19,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (argc <= iVar23) {
    piVar19 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar19,"error: bad arguments");
    __cxa_throw(piVar19,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar24 = argv[iVar23];
  strlen(pcVar24);
  std::__cxx11::string::_M_replace((ulong)&params,0,(char *)sVar22,(ulong)pcVar24);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_prefix._M_dataplus._M_p != &arg_prefix.field_2) {
    operator_delete(arg_prefix._M_dataplus._M_p,
                    CONCAT53(arg_prefix.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(arg_prefix.field_2._M_local_buf[2],
                                      arg_prefix.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg._M_dataplus._M_p != &arg.field_2) {
    operator_delete(arg._M_dataplus._M_p,
                    CONCAT71(arg.field_2._M_allocated_capacity._1_7_,arg.field_2._M_local_buf[0]) +
                    1);
  }
  if (params.manifest_file._M_string_length != 0) {
    std::ifstream::ifstream(&arg,(string *)&params.manifest_file,_S_in);
    cVar3 = std::__basic_file<char>::is_open();
    local_460 = (XXH64_state_t *)CONCAT71(local_460._1_7_,cVar3);
    if (cVar3 == '\0') {
      bVar20 = false;
      bVar2 = false;
      bVar1 = false;
      bVar31 = false;
    }
    else {
      manifest_entry_line._M_dataplus._M_p = (pointer)&manifest_entry_line.field_2;
      manifest_entry_line._M_string_length = 0;
      manifest_entry_line.field_2._M_local_buf[0] = '\0';
      bVar20 = false;
      psVar27 = (string *)uuidv5_namespace;
      bVar2 = false;
      bVar1 = false;
      bVar31 = false;
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(arg._M_dataplus._M_p + -0x18) + (char)&arg);
        piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&arg,(string *)&manifest_entry_line,cVar3);
        if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&arg_prefix,(string *)&manifest_entry_line,_S_in);
        uuidv5_namespace[8] = '\0';
        uuidv5_namespace[9] = '\0';
        uuidv5_namespace[10] = '\0';
        uuidv5_namespace[0xb] = '\0';
        uuidv5_namespace[0xc] = '\0';
        uuidv5_namespace[0xd] = '\0';
        uuidv5_namespace[0xe] = '\0';
        uuidv5_namespace[0xf] = '\0';
        local_4a8._0_8_ = local_4a8._0_8_ & 0xffffffffffffff00;
        uuidv5_namespace._0_8_ = local_4a8;
        piVar13 = std::operator>>((istream *)&arg_prefix,psVar27);
        if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) == 0) {
          iVar23 = std::__cxx11::string::compare((char *)psVar27);
          if (iVar23 == 0) {
            bVar2 = true;
          }
          else {
            iVar23 = std::__cxx11::string::compare((char *)psVar27);
            if (iVar23 == 0) {
              bVar1 = true;
            }
            else {
              iVar23 = std::__cxx11::string::compare((char *)psVar27);
              if (iVar23 == 0) {
                bVar31 = true;
              }
              else {
                iVar23 = std::__cxx11::string::compare((char *)psVar27);
                if (iVar23 == 0) {
                  bVar20 = true;
                }
              }
            }
          }
        }
        if ((undefined1 *)uuidv5_namespace._0_8_ != local_4a8) {
          operator_delete((void *)uuidv5_namespace._0_8_,local_4a8._0_8_ + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&arg_prefix);
        std::ios_base::~ios_base(local_340);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)manifest_entry_line._M_dataplus._M_p != &manifest_entry_line.field_2) {
        operator_delete(manifest_entry_line._M_dataplus._M_p,
                        CONCAT71(manifest_entry_line.field_2._M_allocated_capacity._1_7_,
                                 manifest_entry_line.field_2._M_local_buf[0]) + 1);
      }
    }
    std::ifstream::~ifstream(&arg);
    if ((char)local_460 == '\0') {
      printf("ERROR cannot open manifest %s",params.manifest_file._M_dataplus._M_p);
      uVar11 = 5;
      goto LAB_00103b60;
    }
    if (bVar2) {
      printf("manifest  %s");
LAB_001029f9:
      printf("  sha256");
    }
    else {
      if (!(bool)(bVar1 | bVar31 | bVar20)) {
        printf("ERROR manifest does not have any known hash format in %s");
        uVar11 = 4;
        goto LAB_00103b60;
      }
      printf("manifest  %s");
      if (bVar2) goto LAB_001029f9;
    }
    if (bVar1) {
      printf("  sha1");
    }
    if (bVar31) {
      printf("  xxh64");
    }
    if (bVar20) {
      printf("  uuid");
    }
    putchar(10);
    if ((((params.xxh64 == false) && (params.sha1 == false)) && (params.uuid == false)) &&
       (params.sha256 == false)) {
      if (bVar2) {
        params.sha256 = true;
        params.uuid = false;
      }
      else if (bVar1) {
        params.xxh64 = false;
        params.sha1 = true;
      }
      else if (bVar31) {
        params.xxh64 = true;
      }
      else if (bVar20) {
        params.uuid = true;
      }
    }
    params.manifest_is_usable = true;
  }
  if (((params.xxh64 == false) && (params.sha1 == false)) &&
     ((params.uuid == false && (params.sha256 == false)))) {
    params.xxh64 = true;
  }
  ctx_data = (ggml_context *)0x0;
  if (params.xxh64 == true) {
    statePtr = XXH64_createState();
    if (statePtr == (XXH64_state_t *)0x0) {
      abort();
    }
    XVar10 = XXH64_reset(statePtr,0);
    if (XVar10 == XXH_ERROR) {
      abort();
    }
  }
  else {
    statePtr = (XXH64_state_t *)0x0;
  }
  if (params.sha1 == true) {
    SHA1Init((SHA1_CTX *)&arg_prefix);
  }
  if (params.sha256 == true) {
    sha256_init((sha256_t *)&arg);
  }
  if (params.uuid == true) {
    uuidv5_namespace[0] = 0xef;
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\x12';
    uuidv5_namespace[3] = '\x06';
    uuidv5_namespace[4] = 0xda;
    uuidv5_namespace[5] = 0xdc;
    uuidv5_namespace[6] = '_';
    uuidv5_namespace[7] = 'm';
    uuidv5_namespace[8] = 0xa1;
    uuidv5_namespace[9] = '_';
    uuidv5_namespace[10] = '3';
    uuidv5_namespace[0xb] = 'Y';
    uuidv5_namespace[0xc] = 0xe5;
    uuidv5_namespace[0xd] = 'w';
    uuidv5_namespace[0xe] = 0xd4;
    uuidv5_namespace[0xf] = 0xe5;
    SHA1Init((SHA1_CTX *)&manifest_entry_line);
    SHA1Update((SHA1_CTX *)&manifest_entry_line,uuidv5_namespace,0x10);
  }
  uVar14 = gguf_init_from_file(params.input._M_dataplus._M_p,0,&ctx_data);
  uVar11 = gguf_get_n_tensors(uVar14);
  local_468 = uVar14;
  if ((int)uVar11 < 1) {
    bVar20 = false;
    bVar31 = false;
  }
  else {
    psVar27 = (string *)0x10a205;
    uVar28 = 0;
    bVar31 = false;
    bVar20 = false;
    local_460 = statePtr;
    do {
      uVar15 = gguf_get_tensor_name(uVar14);
      lVar16 = ggml_get_tensor(ctx_data,uVar15);
      md = (uchar *)ggml_nbytes(lVar16);
      puVar30 = *(uchar **)(lVar16 + 0xf8);
      uuidv5_namespace._0_8_ = local_4a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)uuidv5_namespace,params.input._M_dataplus._M_p,
                 params.input._M_dataplus._M_p + params.input._M_string_length);
      std::__cxx11::string::append((char *)uuidv5_namespace);
      plVar17 = (long *)std::__cxx11::string::append((char *)uuidv5_namespace);
      tensor_layer_name._M_dataplus._M_p = (pointer)&tensor_layer_name.field_2;
      psVar21 = (size_type *)(plVar17 + 2);
      if ((size_type *)*plVar17 == psVar21) {
        tensor_layer_name.field_2._M_allocated_capacity = *psVar21;
        tensor_layer_name.field_2._8_8_ = plVar17[3];
      }
      else {
        tensor_layer_name.field_2._M_allocated_capacity = *psVar21;
        tensor_layer_name._M_dataplus._M_p = (pointer)*plVar17;
      }
      tensor_layer_name._M_string_length = plVar17[1];
      *plVar17 = (long)psVar21;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if ((undefined1 *)uuidv5_namespace._0_8_ != local_4a8) {
        operator_delete((void *)uuidv5_namespace._0_8_,local_4a8._0_8_ + 1);
      }
      if (params.xxh64 == true) {
        if (params.no_layer == false) {
          XVar18 = XXH64(puVar30,(size_t)md,0);
          lVar16 = 0x38;
          sVar32 = 0x11;
          pcVar24 = hex_result;
          do {
            snprintf(pcVar24,sVar32,"%02x",XVar18 >> ((byte)lVar16 & 0x3f) & 0xff);
            lVar16 = lVar16 + -8;
            sVar32 = sVar32 - 2;
            pcVar24 = pcVar24 + 2;
          } while (lVar16 != -8);
          if (params.manifest_is_usable == false) {
            printf("%-8s  %-s  %s\n","xxh64",hex_result,tensor_layer_name._M_dataplus._M_p);
            uVar14 = local_468;
          }
          else {
            uuidv5_namespace._0_8_ = local_4a8;
            uuidv5_namespace[8] = '\x05';
            uuidv5_namespace[9] = '\0';
            uuidv5_namespace[10] = '\0';
            uuidv5_namespace[0xb] = '\0';
            uuidv5_namespace[0xc] = '\0';
            uuidv5_namespace[0xd] = '\0';
            uuidv5_namespace[0xe] = '\0';
            uuidv5_namespace[0xf] = '\0';
            local_4a8._0_6_ = 0x3436687878;
            result_1._0_8_ = result_1 + 0x10;
            sVar32 = strlen(hex_result);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)result_1,hex_result,hex_result + sVar32);
            uVar14 = local_468;
            hVar12 = manifest_verify(&params.manifest_file,(string *)uuidv5_namespace,
                                     (string *)result_1,&tensor_layer_name);
            if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
              operator_delete((void *)result_1._0_8_,
                              CONCAT17(result_1[0x17],
                                       CONCAT16(result_1[0x16],
                                                CONCAT15(result_1[0x15],
                                                         CONCAT14(result_1[0x14],result_1._16_4_))))
                              + 1);
            }
            if ((undefined1 *)uuidv5_namespace._0_8_ != local_4a8) {
              operator_delete((void *)uuidv5_namespace._0_8_,local_4a8._0_8_ + 1);
            }
            if (hVar12 == HASH_MANIFEST_MISMATCH) {
              bVar20 = true;
LAB_00102f0b:
              bVar31 = true;
            }
            else if (hVar12 == HASH_MANIFEST_OK) goto LAB_00102f0b;
            pcVar24 = "?";
            if (hVar12 < (HASH_MANIFEST_OK|HASH_MANIFEST_MISMATCH)) {
              pcVar24 = (&PTR_anon_var_dwarf_368_0010cd50)[hVar12];
            }
            printf("%-8s  %-s  %s  -  %s\n","xxh64",hex_result,tensor_layer_name._M_dataplus._M_p,
                   pcVar24);
          }
        }
        XVar10 = XXH64_update(local_460,puVar30,(size_t)md);
        if (XVar10 == XXH_ERROR) {
          abort();
        }
      }
      if (params.sha1 == true) {
        if (params.no_layer == false) {
          pbVar29 = (byte *)result;
          SHA1(pbVar29,(size_t)puVar30,md);
          uStack_497 = 0;
          uStack_493 = 0;
          local_4a8._0_8_ = 0;
          local_4a8[8] = '\0';
          local_4a8._9_4_ = 0;
          local_4a8._13_4_ = 0;
          uuidv5_namespace[0] = '\0';
          uuidv5_namespace[1] = '\0';
          uuidv5_namespace[2] = '\0';
          uuidv5_namespace[3] = '\0';
          uuidv5_namespace[4] = '\0';
          uuidv5_namespace[5] = '\0';
          uuidv5_namespace[6] = '\0';
          uuidv5_namespace[7] = '\0';
          uuidv5_namespace[8] = '\0';
          uuidv5_namespace[9] = '\0';
          uuidv5_namespace[10] = '\0';
          uuidv5_namespace[0xb] = '\0';
          uuidv5_namespace[0xc] = '\0';
          uuidv5_namespace[0xd] = '\0';
          uuidv5_namespace[0xe] = '\0';
          uuidv5_namespace[0xf] = '\0';
          sVar32 = 0x29;
          psVar25 = (string *)uuidv5_namespace;
          do {
            snprintf((char *)psVar25,sVar32,"%02x",(ulong)*pbVar29);
            sVar32 = sVar32 - 2;
            pbVar29 = pbVar29 + 1;
            psVar25 = (string *)((long)&(psVar25->_M_dataplus)._M_p + 2);
          } while (sVar32 != 1);
          if (params.manifest_is_usable == false) {
            printf("%-8s  %-s  %s\n","sha1",(string *)uuidv5_namespace,
                   tensor_layer_name._M_dataplus._M_p);
          }
          else {
            result_1._0_8_ = result_1 + 0x10;
            builtin_memcpy(result_1 + 0x10,"sha1",5);
            result_1[8] = '\x04';
            result_1[9] = '\0';
            result_1[10] = '\0';
            result_1[0xb] = '\0';
            result_1[0xc] = '\0';
            result_1[0xd] = '\0';
            result_1[0xe] = '\0';
            result_1[0xf] = '\0';
            hex_result._0_8_ = hex_result + 0x10;
            sVar32 = strlen((char *)uuidv5_namespace);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)hex_result,(string *)uuidv5_namespace,uuidv5_namespace + sVar32);
            hVar12 = manifest_verify(&params.manifest_file,(string *)result_1,(string *)hex_result,
                                     &tensor_layer_name);
            if ((char *)hex_result._0_8_ != hex_result + 0x10) {
              operator_delete((void *)hex_result._0_8_,
                              CONCAT17(uStack_561,
                                       CONCAT16(uStack_562,
                                                CONCAT24(uStack_564,stack0xfffffffffffffa98))) + 1);
            }
            if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
              operator_delete((void *)result_1._0_8_,
                              CONCAT17(result_1[0x17],
                                       CONCAT16(result_1[0x16],
                                                CONCAT15(result_1[0x15],
                                                         CONCAT14(result_1[0x14],result_1._16_4_))))
                              + 1);
            }
            if (hVar12 == HASH_MANIFEST_MISMATCH) {
              bVar20 = true;
LAB_001030df:
              bVar31 = true;
            }
            else if (hVar12 == HASH_MANIFEST_OK) goto LAB_001030df;
            pcVar24 = "?";
            if (hVar12 < (HASH_MANIFEST_OK|HASH_MANIFEST_MISMATCH)) {
              pcVar24 = (&PTR_anon_var_dwarf_368_0010cd50)[hVar12];
            }
            printf("%-8s  %-s  %s  -  %s\n","sha1",(string *)uuidv5_namespace,
                   tensor_layer_name._M_dataplus._M_p,pcVar24);
          }
        }
        SHA1Update((SHA1_CTX *)&arg_prefix,puVar30,(uint32_t)md);
      }
      if (params.sha256 == true) {
        if (params.no_layer == false) {
          pbVar29 = result_1;
          sha256_hash(pbVar29,puVar30,(size_t)md);
          local_488 = 0;
          uStack_480 = 0;
          uStack_497 = 0;
          uStack_493 = 0;
          uStack_48f = 0;
          local_4a8._0_8_ = 0;
          local_4a8[8] = '\0';
          local_4a8._9_4_ = 0;
          local_4a8._13_4_ = 0;
          uuidv5_namespace[0] = '\0';
          uuidv5_namespace[1] = '\0';
          uuidv5_namespace[2] = '\0';
          uuidv5_namespace[3] = '\0';
          uuidv5_namespace[4] = '\0';
          uuidv5_namespace[5] = '\0';
          uuidv5_namespace[6] = '\0';
          uuidv5_namespace[7] = '\0';
          uuidv5_namespace[8] = '\0';
          uuidv5_namespace[9] = '\0';
          uuidv5_namespace[10] = '\0';
          uuidv5_namespace[0xb] = '\0';
          uuidv5_namespace[0xc] = '\0';
          uuidv5_namespace[0xd] = '\0';
          uuidv5_namespace[0xe] = '\0';
          uuidv5_namespace[0xf] = '\0';
          local_478 = 0;
          sVar32 = 0x41;
          psVar25 = (string *)uuidv5_namespace;
          do {
            snprintf((char *)psVar25,sVar32,"%02x",(ulong)*pbVar29);
            sVar32 = sVar32 - 2;
            pbVar29 = pbVar29 + 1;
            psVar25 = (string *)((long)&(psVar25->_M_dataplus)._M_p + 2);
          } while (sVar32 != 1);
          if (params.manifest_is_usable == false) {
            printf("%-8s  %-s  %s\n","sha256",(string *)uuidv5_namespace,
                   tensor_layer_name._M_dataplus._M_p);
          }
          else {
            hex_result._0_8_ = hex_result + 0x10;
            uStack_564 = 0x3635;
            stack0xfffffffffffffa98 = 0x32616873;
            hex_result[8] = '\x06';
            hex_result[9] = '\0';
            hex_result[10] = '\0';
            hex_result[0xb] = '\0';
            hex_result[0xc] = '\0';
            hex_result[0xd] = '\0';
            hex_result[0xe] = '\0';
            hex_result[0xf] = '\0';
            uStack_562 = '\0';
            result._0_8_ = result + 0x10;
            sVar32 = strlen((char *)uuidv5_namespace);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)result,(string *)uuidv5_namespace,uuidv5_namespace + sVar32);
            hVar12 = manifest_verify(&params.manifest_file,(string *)hex_result,(string *)result,
                                     &tensor_layer_name);
            if ((char *)result._0_8_ != result + 0x10) {
              operator_delete((void *)result._0_8_,stack0xfffffffffffffbc8 + 1);
            }
            if ((char *)hex_result._0_8_ != hex_result + 0x10) {
              operator_delete((void *)hex_result._0_8_,
                              CONCAT17(uStack_561,(uint7)CONCAT24(0x3635,stack0xfffffffffffffa98)) +
                              1);
            }
            if (hVar12 == HASH_MANIFEST_MISMATCH) {
              bVar20 = true;
LAB_001032cb:
              bVar31 = true;
            }
            else if (hVar12 == HASH_MANIFEST_OK) goto LAB_001032cb;
            pcVar24 = "?";
            if (hVar12 < (HASH_MANIFEST_OK|HASH_MANIFEST_MISMATCH)) {
              pcVar24 = (&PTR_anon_var_dwarf_368_0010cd50)[hVar12];
            }
            printf("%-8s  %-s  %s  -  %s\n","sha256",(string *)uuidv5_namespace,
                   tensor_layer_name._M_dataplus._M_p,pcVar24);
          }
        }
        sha256_update((sha256_t *)&arg,puVar30,(size_t)md);
      }
      if (params.uuid == true) {
        SHA1Update((SHA1_CTX *)&manifest_entry_line,puVar30,(uint32_t)md);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tensor_layer_name._M_dataplus._M_p != &tensor_layer_name.field_2) {
        operator_delete(tensor_layer_name._M_dataplus._M_p,
                        tensor_layer_name.field_2._M_allocated_capacity + 1);
      }
      uVar28 = uVar28 + 1;
      statePtr = local_460;
    } while (uVar28 != (uVar11 & 0x7fffffff));
  }
  if (params.xxh64 == false) {
    uVar28 = 0;
    bVar1 = false;
  }
  else {
    XVar18 = XXH64_digest(statePtr);
    lVar16 = 0x38;
    sVar32 = 0x11;
    puVar30 = result_1;
    do {
      snprintf((char *)puVar30,sVar32,"%02x",XVar18 >> ((byte)lVar16 & 0x3f) & 0xff);
      lVar16 = lVar16 + -8;
      sVar32 = sVar32 - 2;
      puVar30 = puVar30 + 2;
    } while (lVar16 != -8);
    if (params.manifest_is_usable == false) {
      uVar28 = 0;
      printf("%-8s  %-s  %s\n","xxh64",result_1,params.input._M_dataplus._M_p);
      bVar1 = false;
      uVar14 = local_468;
    }
    else {
      local_4a8._0_6_ = 0x3436687878;
      uuidv5_namespace[8] = '\x05';
      uuidv5_namespace[9] = '\0';
      uuidv5_namespace[10] = '\0';
      uuidv5_namespace[0xb] = '\0';
      uuidv5_namespace[0xc] = '\0';
      uuidv5_namespace[0xd] = '\0';
      uuidv5_namespace[0xe] = '\0';
      uuidv5_namespace[0xf] = '\0';
      tensor_layer_name._M_dataplus._M_p = (pointer)&tensor_layer_name.field_2;
      uuidv5_namespace._0_8_ = local_4a8;
      sVar32 = strlen((char *)result_1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tensor_layer_name,result_1,result_1 + sVar32);
      uVar14 = local_468;
      hVar12 = manifest_verify(&params.manifest_file,(string *)uuidv5_namespace,&tensor_layer_name,
                               &params.input);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tensor_layer_name._M_dataplus._M_p != &tensor_layer_name.field_2) {
        operator_delete(tensor_layer_name._M_dataplus._M_p,
                        tensor_layer_name.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)uuidv5_namespace._0_8_ != local_4a8) {
        operator_delete((void *)uuidv5_namespace._0_8_,local_4a8._0_8_ + 1);
      }
      if (hVar12 == HASH_MANIFEST_MISMATCH) {
        uVar28 = CONCAT71((int7)((ulong)psVar27 >> 8),1);
        bVar1 = true;
      }
      else if (hVar12 == HASH_MANIFEST_OK) {
        bVar1 = true;
        uVar28 = 0;
      }
      else {
        uVar28 = 0;
        bVar1 = false;
      }
      if (hVar12 < (HASH_MANIFEST_OK|HASH_MANIFEST_MISMATCH)) {
        pcVar24 = (&PTR_anon_var_dwarf_368_0010cd50)[hVar12];
      }
      else {
        pcVar24 = "?";
      }
      printf("%-8s  %-s  %s  -  %s\n","xxh64",result_1,params.input._M_dataplus._M_p,pcVar24);
    }
  }
  if (params.sha1 == true) {
    pbVar29 = (byte *)hex_result;
    SHA1Final(pbVar29,(SHA1_CTX *)&arg_prefix);
    sVar32 = 0x29;
    puVar30 = uuidv5_namespace;
    do {
      snprintf((char *)puVar30,sVar32,"%02x",(ulong)*pbVar29);
      sVar32 = sVar32 - 2;
      pbVar29 = pbVar29 + 1;
      puVar30 = puVar30 + 2;
    } while (sVar32 != 1);
    if (params.manifest_is_usable == false) {
      printf("%-8s  %-s  %s\n","sha1",uuidv5_namespace,params.input._M_dataplus._M_p);
    }
    else {
      tensor_layer_name._M_string_length = 4;
      tensor_layer_name.field_2._M_allocated_capacity._0_5_ = 0x31616873;
      result_1._0_8_ = result_1 + 0x10;
      tensor_layer_name._M_dataplus._M_p = (pointer)&tensor_layer_name.field_2;
      sVar32 = strlen((char *)uuidv5_namespace);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)result_1,uuidv5_namespace,uuidv5_namespace + sVar32);
      hVar12 = manifest_verify(&params.manifest_file,&tensor_layer_name,(string *)result_1,
                               &params.input);
      if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
        operator_delete((void *)result_1._0_8_,
                        CONCAT17(result_1[0x17],
                                 CONCAT16(result_1[0x16],
                                          CONCAT15(result_1[0x15],
                                                   CONCAT14(result_1[0x14],result_1._16_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tensor_layer_name._M_dataplus._M_p != &tensor_layer_name.field_2) {
        operator_delete(tensor_layer_name._M_dataplus._M_p,
                        tensor_layer_name.field_2._M_allocated_capacity + 1);
      }
      if (hVar12 == HASH_MANIFEST_MISMATCH) {
        uVar28 = CONCAT71((int7)(uVar28 >> 8),1);
LAB_00103690:
        bVar1 = true;
      }
      else if (hVar12 == HASH_MANIFEST_OK) goto LAB_00103690;
      if (hVar12 < (HASH_MANIFEST_OK|HASH_MANIFEST_MISMATCH)) {
        pcVar24 = (&PTR_anon_var_dwarf_368_0010cd50)[hVar12];
      }
      else {
        pcVar24 = "?";
      }
      printf("%-8s  %-s  %s  -  %s\n","sha1",uuidv5_namespace,params.input._M_dataplus._M_p,pcVar24)
      ;
    }
  }
  if (params.sha256 == true) {
    psVar25 = &tensor_layer_name;
    sha256_final((sha256_t *)&arg,(uchar *)psVar25);
    puVar30 = uuidv5_namespace;
    local_488 = 0;
    uStack_480 = 0;
    uStack_497 = 0;
    uStack_493 = 0;
    uStack_48f = 0;
    local_4a8._0_8_ = 0;
    local_4a8[8] = '\0';
    local_4a8._9_4_ = 0;
    local_4a8._13_4_ = 0;
    uuidv5_namespace[0] = '\0';
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\0';
    uuidv5_namespace[3] = '\0';
    uuidv5_namespace[4] = '\0';
    uuidv5_namespace[5] = '\0';
    uuidv5_namespace[6] = '\0';
    uuidv5_namespace[7] = '\0';
    uuidv5_namespace[8] = '\0';
    uuidv5_namespace[9] = '\0';
    uuidv5_namespace[10] = '\0';
    uuidv5_namespace[0xb] = '\0';
    uuidv5_namespace[0xc] = '\0';
    uuidv5_namespace[0xd] = '\0';
    uuidv5_namespace[0xe] = '\0';
    uuidv5_namespace[0xf] = '\0';
    local_478 = 0;
    sVar32 = 0x41;
    do {
      snprintf((char *)puVar30,sVar32,"%02x",(ulong)*(byte *)&(psVar25->_M_dataplus)._M_p);
      sVar32 = sVar32 - 2;
      psVar25 = (string *)((long)&(psVar25->_M_dataplus)._M_p + 1);
      puVar30 = puVar30 + 2;
    } while (sVar32 != 1);
    if (params.manifest_is_usable == false) {
      printf("%-8s  %-s  %s\n","sha256",uuidv5_namespace,params.input._M_dataplus._M_p);
    }
    else {
      builtin_memcpy(result_1 + 0x10,"sha256",7);
      result_1[8] = '\x06';
      result_1[9] = '\0';
      result_1[10] = '\0';
      result_1[0xb] = '\0';
      result_1[0xc] = '\0';
      result_1[0xd] = '\0';
      result_1[0xe] = '\0';
      result_1[0xf] = '\0';
      hex_result._0_8_ = hex_result + 0x10;
      result_1._0_8_ = result_1 + 0x10;
      sVar32 = strlen((char *)uuidv5_namespace);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)hex_result,uuidv5_namespace,uuidv5_namespace + sVar32);
      hVar12 = manifest_verify(&params.manifest_file,(string *)result_1,(string *)hex_result,
                               &params.input);
      if ((char *)hex_result._0_8_ != hex_result + 0x10) {
        operator_delete((void *)hex_result._0_8_,
                        CONCAT17(uStack_561,
                                 CONCAT16(uStack_562,CONCAT24(uStack_564,stack0xfffffffffffffa98)))
                        + 1);
      }
      if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
        operator_delete((void *)result_1._0_8_,
                        CONCAT17(result_1[0x17],
                                 CONCAT16(result_1[0x16],
                                          CONCAT15(result_1[0x15],
                                                   CONCAT14(result_1[0x14],result_1._16_4_)))) + 1);
      }
      if (hVar12 == HASH_MANIFEST_MISMATCH) {
        uVar28 = CONCAT71((int7)(uVar28 >> 8),1);
LAB_00103835:
        bVar1 = true;
      }
      else if (hVar12 == HASH_MANIFEST_OK) goto LAB_00103835;
      if (hVar12 < (HASH_MANIFEST_OK|HASH_MANIFEST_MISMATCH)) {
        pcVar24 = (&PTR_anon_var_dwarf_368_0010cd50)[hVar12];
      }
      else {
        pcVar24 = "?";
      }
      printf("%-8s  %-s  %s  -  %s\n","sha256",uuidv5_namespace,params.input._M_dataplus._M_p,
             pcVar24);
    }
  }
  if (params.uuid == true) {
    SHA1Final((uchar *)hex_result,(SHA1_CTX *)&manifest_entry_line);
    local_454 = (uint)uVar28;
    local_460 = (XXH64_state_t *)((ulong)hex_result._0_8_ >> 0x38);
    local_4a8._0_8_ = 0;
    local_4a8[8] = '\0';
    local_4a8._9_4_ = 0;
    uuidv5_namespace[0] = '\0';
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\0';
    uuidv5_namespace[3] = '\0';
    uuidv5_namespace[4] = '\0';
    uuidv5_namespace[5] = '\0';
    uuidv5_namespace[6] = '\0';
    uuidv5_namespace[7] = '\0';
    uuidv5_namespace[8] = '\0';
    uuidv5_namespace[9] = '\0';
    uuidv5_namespace[10] = '\0';
    uuidv5_namespace[0xb] = '\0';
    uuidv5_namespace[0xc] = '\0';
    uuidv5_namespace[0xd] = '\0';
    uuidv5_namespace[0xe] = '\0';
    uuidv5_namespace[0xf] = '\0';
    local_4a8._13_4_ = 0;
    uStack_497 = 0;
    snprintf((char *)uuidv5_namespace,0x25,
             "%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
             hex_result._0_8_ & 0xff,(ulong)hex_result._0_8_ >> 8 & 0xff,
             (ulong)hex_result._0_8_ >> 0x10 & 0xff,(ulong)hex_result._0_8_ >> 0x18 & 0xff,
             (ulong)hex_result._0_8_ >> 0x20 & 0xff,(ulong)hex_result._0_8_ >> 0x28 & 0xff,
             (ulong)((byte)hex_result[6] & 0xf | 0x50),local_460,
             (ulong)((byte)hex_result[8] & 0x3f | 0x80),(ulong)hex_result._8_8_ >> 8 & 0xff,
             (ulong)hex_result._8_8_ >> 0x10 & 0xff,(ulong)hex_result._8_8_ >> 0x18 & 0xff,
             (ulong)hex_result._8_8_ >> 0x20 & 0xff,(ulong)hex_result._8_8_ >> 0x28 & 0xff,
             (ulong)hex_result._8_8_ >> 0x30 & 0xff,(ulong)hex_result._8_8_ >> 0x38);
    if (params.manifest_is_usable == true) {
      tensor_layer_name._M_string_length = 6;
      tensor_layer_name.field_2._M_allocated_capacity._0_7_ = 0x363532616873;
      result_1._0_8_ = result_1 + 0x10;
      tensor_layer_name._M_dataplus._M_p = (pointer)&tensor_layer_name.field_2;
      sVar32 = strlen((char *)uuidv5_namespace);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)result_1,uuidv5_namespace,uuidv5_namespace + sVar32);
      hVar12 = manifest_verify(&params.manifest_file,&tensor_layer_name,(string *)result_1,
                               &params.input);
      uVar14 = local_468;
      uVar28 = (ulong)local_454;
      if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
        operator_delete((void *)result_1._0_8_,
                        CONCAT17(result_1[0x17],
                                 CONCAT16(result_1[0x16],
                                          CONCAT15(result_1[0x15],
                                                   CONCAT14(result_1[0x14],result_1._16_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tensor_layer_name._M_dataplus._M_p != &tensor_layer_name.field_2) {
        operator_delete(tensor_layer_name._M_dataplus._M_p,
                        tensor_layer_name.field_2._M_allocated_capacity + 1);
      }
      if (hVar12 == HASH_MANIFEST_MISMATCH) {
        uVar28 = 1;
LAB_00103a95:
        bVar1 = true;
      }
      else if (hVar12 == HASH_MANIFEST_OK) goto LAB_00103a95;
      if (hVar12 < (HASH_MANIFEST_OK|HASH_MANIFEST_MISMATCH)) {
        pcVar24 = (&PTR_anon_var_dwarf_368_0010cd50)[hVar12];
      }
      else {
        pcVar24 = "?";
      }
      printf("%-8s  %-s  %s  -  %s\n","uuid",uuidv5_namespace,params.input._M_dataplus._M_p,pcVar24)
      ;
    }
    else {
      printf("%-8s  %-s  %s\n","uuid",uuidv5_namespace,params.input._M_dataplus._M_p);
      uVar28 = (ulong)local_454;
      uVar14 = local_468;
    }
  }
  ggml_free(ctx_data);
  gguf_free(uVar14);
  if (params.manifest_is_usable == true) {
    if (bVar1) {
      if ((!bVar31) || (uVar26 = 1, !bVar20)) {
        uVar26 = uVar28 & 0xffffffff;
      }
    }
    else {
      uVar26 = 3;
      if (bVar31) {
        uVar26 = (ulong)bVar20;
      }
    }
  }
  else {
    uVar26 = 0;
  }
  uVar11 = (uint)uVar26;
  if (params.manifest_is_usable != false) {
    printf("\nVerification results for %s - %s\n",params.manifest_file._M_dataplus._M_p,
           (long)&DAT_0010a3d0 + (long)(int)(&DAT_0010a3d0)[uVar26 & 0xff]);
  }
LAB_00103b60:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)params.manifest_file._M_dataplus._M_p != &params.manifest_file.field_2) {
    operator_delete(params.manifest_file._M_dataplus._M_p,
                    CONCAT71(params.manifest_file.field_2._M_allocated_capacity._1_7_,
                             params.manifest_file.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)params.input._M_dataplus._M_p != &params.input.field_2) {
    operator_delete(params.input._M_dataplus._M_p,
                    CONCAT71(params.input.field_2._M_allocated_capacity._1_7_,
                             params.input.field_2._M_local_buf[0]) + 1);
  }
  return uVar11 & 0xff;
}

Assistant:

int main(int argc, const char ** argv) {
    hash_params params;
    manifest_check_params manifest_check;
    hash_params_parse(argc, argv, params);

    if (!params.manifest_file.empty()) {
        if (!manifest_type(params.manifest_file, manifest_check)) {
            printf("ERROR cannot open manifest %s", params.manifest_file.c_str());
            return HASH_EXIT_MANIFEST_FILE_ERROR;
        }

        if (!manifest_check.sha256 && !manifest_check.sha1 && !manifest_check.xxh64 && !manifest_check.uuid) {
            printf("ERROR manifest does not have any known hash format in %s", params.manifest_file.c_str());
            return HASH_EXIT_MANIFEST_UNKNOWN_HASH;
        }

        printf("manifest  %s", params.manifest_file.c_str());

        if (manifest_check.sha256) {
            printf("  sha256");
        }

        if (manifest_check.sha1) {
            printf("  sha1");
        }

        if (manifest_check.xxh64) {
            printf("  xxh64");
        }

        if (manifest_check.uuid) {
            printf("  uuid");
        }

        printf("\n");

        // Autoselect the highest security hash if manifest is provided but
        // the user has not specifically defined the hash they care about
        if (!params.xxh64 && !params.sha1 && !params.uuid && !params.sha256) {
            // User has not selected a specific value, pick most secure hash
            if (manifest_check.sha256) {
                params.sha256 = true;
            } else if (manifest_check.sha1) {
                params.sha1 = true;
            } else if (manifest_check.xxh64) {
                params.xxh64 = true;
            } else if (manifest_check.uuid) {
                params.uuid = true;
            }
        }

        params.manifest_is_usable = true;
    }

    // By default if no swich argument provided, assume xxh64
    if (!params.xxh64 && !params.sha1 && !params.uuid && !params.sha256) {
        params.xxh64 = true;
    }

    hash_exit_code_t exit_code = gguf_hash(params);

    if (params.manifest_is_usable) {
        printf("\nVerification results for %s - %s\n", params.manifest_file.c_str(), hash_exit_code_to_str(exit_code));
    }

    return exit_code;
}